

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>,false>
               (HighsDomainChange *begin,
               __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
               end,int param_3,byte param_4)

{
  double dVar1;
  HighsInt HVar2;
  HighsBoundType HVar3;
  HighsInt HVar4;
  long lVar5;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  _Var6;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  _Var7;
  int iVar8;
  HighsDomainChange *pHVar9;
  HighsDomainChange *pHVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  HighsBoundType HVar14;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  _Var15;
  HighsDomainChange *pHVar16;
  HighsDomainChange *pHVar17;
  HighsDomainChange *pHVar18;
  long lVar19;
  pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
  pVar20;
  _Iter_comp_iter<std::less<HighsDomainChange>_> __cmp;
  double local_78;
  undefined8 uStack_70;
  HighsDomainChange *local_60;
  HighsDomainChange *local_58;
  int local_4c;
  HighsDomainChange *local_48;
  HighsDomainChange *local_40;
  ulong local_38;
  
  uVar13 = (long)end._M_current - (long)begin >> 4;
  if ((long)uVar13 < 0x18) {
    if (param_4 == 0) {
LAB_002a5aec:
      pHVar9 = begin + 1;
      if (begin + 1 == end._M_current || begin == end._M_current) {
        return;
      }
      do {
        pHVar10 = pHVar9;
        iVar8 = begin[1].column;
        if (iVar8 < begin->column) {
          HVar14 = begin[1].boundtype;
LAB_002a5b17:
          dVar1 = pHVar10->boundval;
          do {
            do {
              pHVar9 = begin;
              HVar2 = pHVar9->column;
              HVar3 = pHVar9->boundtype;
              pHVar9[1].boundval = pHVar9->boundval;
              pHVar9[1].column = HVar2;
              pHVar9[1].boundtype = HVar3;
              begin = pHVar9 + -1;
            } while (iVar8 < pHVar9[-1].column);
          } while ((iVar8 <= pHVar9[-1].column) &&
                  (((int)HVar14 < (int)pHVar9[-1].boundtype ||
                   (((int)HVar14 <= (int)pHVar9[-1].boundtype && (dVar1 < begin->boundval))))));
          pHVar9->boundval = dVar1;
          pHVar9->column = iVar8;
          pHVar9->boundtype = HVar14;
        }
        else if (iVar8 <= begin->column) {
          HVar14 = begin[1].boundtype;
          if (((int)HVar14 < (int)begin->boundtype) ||
             (((int)HVar14 <= (int)begin->boundtype &&
              (pHVar10->boundval <= begin->boundval && begin->boundval != pHVar10->boundval))))
          goto LAB_002a5b17;
        }
        pHVar9 = pHVar10 + 1;
        begin = pHVar10;
        if (pHVar10 + 1 == end._M_current) {
          return;
        }
      } while( true );
    }
  }
  else {
    local_60 = end._M_current + -1;
    local_40 = end._M_current + -2;
    local_48 = end._M_current + -3;
    _Var7._M_current = begin;
    local_4c = param_3;
    do {
      uVar11 = uVar13 >> 1;
      pHVar9 = _Var7._M_current + uVar11;
      if (uVar13 < 0x81) {
        iVar8 = (_Var7._M_current)->column;
        if (iVar8 < pHVar9->column) {
LAB_002a50d4:
          local_78 = pHVar9->boundval;
          uStack_70._0_4_ = pHVar9->column;
          uStack_70._4_4_ = pHVar9->boundtype;
          HVar2 = (_Var7._M_current)->column;
          HVar14 = (_Var7._M_current)->boundtype;
          pHVar9->boundval = (_Var7._M_current)->boundval;
          pHVar9->column = HVar2;
          pHVar9->boundtype = HVar14;
          (_Var7._M_current)->boundval = local_78;
          (_Var7._M_current)->column = (undefined4)uStack_70;
          (_Var7._M_current)->boundtype = uStack_70._4_4_;
          iVar8 = (_Var7._M_current)->column;
        }
        else if (iVar8 <= pHVar9->column) {
          if (((int)(_Var7._M_current)->boundtype < (int)pHVar9->boundtype) ||
             (((int)(_Var7._M_current)->boundtype <= (int)pHVar9->boundtype &&
              ((_Var7._M_current)->boundval <= pHVar9->boundval &&
               pHVar9->boundval != (_Var7._M_current)->boundval)))) goto LAB_002a50d4;
        }
        if (end._M_current[-1].column < iVar8) {
LAB_002a5131:
          local_78 = (_Var7._M_current)->boundval;
          uStack_70._0_4_ = (_Var7._M_current)->column;
          uStack_70._4_4_ = (_Var7._M_current)->boundtype;
          HVar2 = local_60->column;
          HVar14 = local_60->boundtype;
          (_Var7._M_current)->boundval = local_60->boundval;
          (_Var7._M_current)->column = HVar2;
          (_Var7._M_current)->boundtype = HVar14;
          local_60->boundval = local_78;
          local_60->column = (undefined4)uStack_70;
          local_60->boundtype = uStack_70._4_4_;
          iVar8 = (_Var7._M_current)->column;
        }
        else if (end._M_current[-1].column <= iVar8) {
          if (((int)end._M_current[-1].boundtype < (int)(_Var7._M_current)->boundtype) ||
             (((int)end._M_current[-1].boundtype <= (int)(_Var7._M_current)->boundtype &&
              (local_60->boundval <= (_Var7._M_current)->boundval &&
               (_Var7._M_current)->boundval != local_60->boundval)))) goto LAB_002a5131;
        }
        if (iVar8 < pHVar9->column) {
LAB_002a518f:
          local_78 = pHVar9->boundval;
          uStack_70._0_4_ = pHVar9->column;
          uStack_70._4_4_ = pHVar9->boundtype;
          HVar2 = (_Var7._M_current)->column;
          HVar14 = (_Var7._M_current)->boundtype;
          pHVar9->boundval = (_Var7._M_current)->boundval;
          pHVar9->column = HVar2;
          pHVar9->boundtype = HVar14;
          (_Var7._M_current)->boundval = local_78;
          (_Var7._M_current)->column = (undefined4)uStack_70;
          (_Var7._M_current)->boundtype = uStack_70._4_4_;
        }
        else if (iVar8 <= pHVar9->column) {
          if (((int)(_Var7._M_current)->boundtype < (int)pHVar9->boundtype) ||
             (((int)(_Var7._M_current)->boundtype <= (int)pHVar9->boundtype &&
              ((_Var7._M_current)->boundval <= pHVar9->boundval &&
               pHVar9->boundval != (_Var7._M_current)->boundval)))) goto LAB_002a518f;
        }
      }
      else {
        iVar8 = pHVar9->column;
        if (iVar8 < (_Var7._M_current)->column) {
LAB_002a50a9:
          dVar1 = (_Var7._M_current)->boundval;
          HVar4 = (_Var7._M_current)->column;
          HVar3 = (_Var7._M_current)->boundtype;
          HVar2 = pHVar9->column;
          HVar14 = pHVar9->boundtype;
          (_Var7._M_current)->boundval = pHVar9->boundval;
          (_Var7._M_current)->column = HVar2;
          (_Var7._M_current)->boundtype = HVar14;
          pHVar9->boundval = dVar1;
          pHVar9->column = HVar4;
          pHVar9->boundtype = HVar3;
          iVar8 = pHVar9->column;
        }
        else if (iVar8 <= (_Var7._M_current)->column) {
          if (((int)pHVar9->boundtype < (int)(_Var7._M_current)->boundtype) ||
             (((int)pHVar9->boundtype <= (int)(_Var7._M_current)->boundtype &&
              (pHVar9->boundval <= (_Var7._M_current)->boundval &&
               (_Var7._M_current)->boundval != pHVar9->boundval)))) goto LAB_002a50a9;
        }
        if (end._M_current[-1].column < iVar8) {
LAB_002a5103:
          dVar1 = pHVar9->boundval;
          HVar4 = pHVar9->column;
          HVar3 = pHVar9->boundtype;
          HVar2 = local_60->column;
          HVar14 = local_60->boundtype;
          pHVar9->boundval = local_60->boundval;
          pHVar9->column = HVar2;
          pHVar9->boundtype = HVar14;
          local_60->boundval = dVar1;
          local_60->column = HVar4;
          local_60->boundtype = HVar3;
          iVar8 = pHVar9->column;
        }
        else if (end._M_current[-1].column <= iVar8) {
          if (((int)end._M_current[-1].boundtype < (int)pHVar9->boundtype) ||
             (((int)end._M_current[-1].boundtype <= (int)pHVar9->boundtype &&
              (local_60->boundval <= pHVar9->boundval && pHVar9->boundval != local_60->boundval))))
          goto LAB_002a5103;
        }
        if (iVar8 < (_Var7._M_current)->column) {
LAB_002a5166:
          dVar1 = (_Var7._M_current)->boundval;
          HVar4 = (_Var7._M_current)->column;
          HVar3 = (_Var7._M_current)->boundtype;
          HVar2 = pHVar9->column;
          HVar14 = pHVar9->boundtype;
          (_Var7._M_current)->boundval = pHVar9->boundval;
          (_Var7._M_current)->column = HVar2;
          (_Var7._M_current)->boundtype = HVar14;
          pHVar9->boundval = dVar1;
          pHVar9->column = HVar4;
          pHVar9->boundtype = HVar3;
        }
        else if (iVar8 <= (_Var7._M_current)->column) {
          if (((int)pHVar9->boundtype < (int)(_Var7._M_current)->boundtype) ||
             (((int)pHVar9->boundtype <= (int)(_Var7._M_current)->boundtype &&
              (pHVar9->boundval <= (_Var7._M_current)->boundval &&
               (_Var7._M_current)->boundval != pHVar9->boundval)))) goto LAB_002a5166;
        }
        pHVar10 = _Var7._M_current + 1;
        pHVar18 = _Var7._M_current + (uVar11 - 1);
        iVar8 = _Var7._M_current[uVar11 - 1].column;
        if (iVar8 < _Var7._M_current[1].column) {
LAB_002a51ce:
          dVar1 = pHVar10->boundval;
          HVar4 = _Var7._M_current[1].column;
          HVar3 = _Var7._M_current[1].boundtype;
          HVar2 = _Var7._M_current[uVar11 - 1].column;
          HVar14 = _Var7._M_current[uVar11 - 1].boundtype;
          pHVar10->boundval = pHVar18->boundval;
          _Var7._M_current[1].column = HVar2;
          _Var7._M_current[1].boundtype = HVar14;
          pHVar18->boundval = dVar1;
          _Var7._M_current[uVar11 - 1].column = HVar4;
          _Var7._M_current[uVar11 - 1].boundtype = HVar3;
          iVar8 = _Var7._M_current[uVar11 - 1].column;
        }
        else if (iVar8 <= _Var7._M_current[1].column) {
          if (((int)_Var7._M_current[uVar11 - 1].boundtype < (int)_Var7._M_current[1].boundtype) ||
             (((int)_Var7._M_current[uVar11 - 1].boundtype <= (int)_Var7._M_current[1].boundtype &&
              (pHVar18->boundval <= pHVar10->boundval && pHVar10->boundval != pHVar18->boundval))))
          goto LAB_002a51ce;
        }
        if (end._M_current[-2].column < iVar8) {
LAB_002a5221:
          dVar1 = pHVar18->boundval;
          HVar4 = _Var7._M_current[uVar11 - 1].column;
          HVar3 = _Var7._M_current[uVar11 - 1].boundtype;
          HVar2 = local_40->column;
          HVar14 = local_40->boundtype;
          pHVar18->boundval = local_40->boundval;
          _Var7._M_current[uVar11 - 1].column = HVar2;
          _Var7._M_current[uVar11 - 1].boundtype = HVar14;
          local_40->boundval = dVar1;
          local_40->column = HVar4;
          local_40->boundtype = HVar3;
          iVar8 = _Var7._M_current[uVar11 - 1].column;
        }
        else if (end._M_current[-2].column <= iVar8) {
          if (((int)end._M_current[-2].boundtype < (int)_Var7._M_current[uVar11 - 1].boundtype) ||
             (((int)end._M_current[-2].boundtype <= (int)_Var7._M_current[uVar11 - 1].boundtype &&
              (local_40->boundval <= pHVar18->boundval && pHVar18->boundval != local_40->boundval)))
             ) goto LAB_002a5221;
        }
        if (iVar8 < _Var7._M_current[1].column) {
LAB_002a5251:
          dVar1 = pHVar10->boundval;
          HVar4 = _Var7._M_current[1].column;
          HVar3 = _Var7._M_current[1].boundtype;
          HVar2 = _Var7._M_current[uVar11 - 1].column;
          HVar14 = _Var7._M_current[uVar11 - 1].boundtype;
          pHVar10->boundval = pHVar18->boundval;
          _Var7._M_current[1].column = HVar2;
          _Var7._M_current[1].boundtype = HVar14;
          pHVar18->boundval = dVar1;
          _Var7._M_current[uVar11 - 1].column = HVar4;
          _Var7._M_current[uVar11 - 1].boundtype = HVar3;
        }
        else if (iVar8 <= _Var7._M_current[1].column) {
          if (((int)_Var7._M_current[uVar11 - 1].boundtype < (int)_Var7._M_current[1].boundtype) ||
             (((int)_Var7._M_current[uVar11 - 1].boundtype <= (int)_Var7._M_current[1].boundtype &&
              (pHVar18->boundval <= pHVar10->boundval && pHVar10->boundval != pHVar18->boundval))))
          goto LAB_002a5251;
        }
        pHVar10 = _Var7._M_current + 2;
        pHVar16 = _Var7._M_current + uVar11 + 1;
        iVar8 = _Var7._M_current[uVar11 + 1].column;
        if (iVar8 < _Var7._M_current[2].column) {
LAB_002a5288:
          dVar1 = pHVar10->boundval;
          HVar4 = _Var7._M_current[2].column;
          HVar3 = _Var7._M_current[2].boundtype;
          HVar2 = _Var7._M_current[uVar11 + 1].column;
          HVar14 = _Var7._M_current[uVar11 + 1].boundtype;
          pHVar10->boundval = pHVar16->boundval;
          _Var7._M_current[2].column = HVar2;
          _Var7._M_current[2].boundtype = HVar14;
          pHVar16->boundval = dVar1;
          _Var7._M_current[uVar11 + 1].column = HVar4;
          _Var7._M_current[uVar11 + 1].boundtype = HVar3;
          iVar8 = _Var7._M_current[uVar11 + 1].column;
        }
        else if (iVar8 <= _Var7._M_current[2].column) {
          if (((int)_Var7._M_current[uVar11 + 1].boundtype < (int)_Var7._M_current[2].boundtype) ||
             (((int)_Var7._M_current[uVar11 + 1].boundtype <= (int)_Var7._M_current[2].boundtype &&
              (pHVar16->boundval <= pHVar10->boundval && pHVar10->boundval != pHVar16->boundval))))
          goto LAB_002a5288;
        }
        if (end._M_current[-3].column < iVar8) {
LAB_002a52b2:
          dVar1 = pHVar16->boundval;
          HVar4 = _Var7._M_current[uVar11 + 1].column;
          HVar3 = _Var7._M_current[uVar11 + 1].boundtype;
          HVar2 = local_48->column;
          HVar14 = local_48->boundtype;
          pHVar16->boundval = local_48->boundval;
          _Var7._M_current[uVar11 + 1].column = HVar2;
          _Var7._M_current[uVar11 + 1].boundtype = HVar14;
          local_48->boundval = dVar1;
          local_48->column = HVar4;
          local_48->boundtype = HVar3;
          iVar8 = _Var7._M_current[uVar11 + 1].column;
        }
        else if (end._M_current[-3].column <= iVar8) {
          if (((int)end._M_current[-3].boundtype < (int)_Var7._M_current[uVar11 + 1].boundtype) ||
             (((int)end._M_current[-3].boundtype <= (int)_Var7._M_current[uVar11 + 1].boundtype &&
              (local_48->boundval <= pHVar16->boundval && pHVar16->boundval != local_48->boundval)))
             ) goto LAB_002a52b2;
        }
        if (iVar8 < _Var7._M_current[2].column) {
LAB_002a52e2:
          dVar1 = pHVar10->boundval;
          HVar4 = _Var7._M_current[2].column;
          HVar3 = _Var7._M_current[2].boundtype;
          HVar2 = _Var7._M_current[uVar11 + 1].column;
          HVar14 = _Var7._M_current[uVar11 + 1].boundtype;
          pHVar10->boundval = pHVar16->boundval;
          _Var7._M_current[2].column = HVar2;
          _Var7._M_current[2].boundtype = HVar14;
          pHVar16->boundval = dVar1;
          _Var7._M_current[uVar11 + 1].column = HVar4;
          _Var7._M_current[uVar11 + 1].boundtype = HVar3;
        }
        else if (iVar8 <= _Var7._M_current[2].column) {
          if (((int)_Var7._M_current[uVar11 + 1].boundtype < (int)_Var7._M_current[2].boundtype) ||
             (((int)_Var7._M_current[uVar11 + 1].boundtype <= (int)_Var7._M_current[2].boundtype &&
              (pHVar16->boundval <= pHVar10->boundval && pHVar10->boundval != pHVar16->boundval))))
          goto LAB_002a52e2;
        }
        iVar8 = pHVar9->column;
        if (iVar8 < _Var7._M_current[uVar11 - 1].column) {
LAB_002a530a:
          dVar1 = pHVar18->boundval;
          HVar4 = _Var7._M_current[uVar11 - 1].column;
          HVar3 = _Var7._M_current[uVar11 - 1].boundtype;
          HVar2 = pHVar9->column;
          HVar14 = pHVar9->boundtype;
          pHVar18->boundval = pHVar9->boundval;
          _Var7._M_current[uVar11 - 1].column = HVar2;
          _Var7._M_current[uVar11 - 1].boundtype = HVar14;
          pHVar9->boundval = dVar1;
          pHVar9->column = HVar4;
          pHVar9->boundtype = HVar3;
          iVar8 = pHVar9->column;
        }
        else if (iVar8 <= _Var7._M_current[uVar11 - 1].column) {
          if (((int)pHVar9->boundtype < (int)_Var7._M_current[uVar11 - 1].boundtype) ||
             (((int)pHVar9->boundtype <= (int)_Var7._M_current[uVar11 - 1].boundtype &&
              (pHVar9->boundval <= pHVar18->boundval && pHVar18->boundval != pHVar9->boundval))))
          goto LAB_002a530a;
        }
        if (_Var7._M_current[uVar11 + 1].column < iVar8) {
LAB_002a5332:
          dVar1 = pHVar9->boundval;
          HVar4 = pHVar9->column;
          HVar3 = pHVar9->boundtype;
          HVar2 = _Var7._M_current[uVar11 + 1].column;
          HVar14 = _Var7._M_current[uVar11 + 1].boundtype;
          pHVar9->boundval = pHVar16->boundval;
          pHVar9->column = HVar2;
          pHVar9->boundtype = HVar14;
          pHVar16->boundval = dVar1;
          _Var7._M_current[uVar11 + 1].column = HVar4;
          _Var7._M_current[uVar11 + 1].boundtype = HVar3;
          iVar8 = pHVar9->column;
        }
        else if (_Var7._M_current[uVar11 + 1].column <= iVar8) {
          if (((int)_Var7._M_current[uVar11 + 1].boundtype < (int)pHVar9->boundtype) ||
             (((int)_Var7._M_current[uVar11 + 1].boundtype <= (int)pHVar9->boundtype &&
              (pHVar16->boundval <= pHVar9->boundval && pHVar9->boundval != pHVar16->boundval))))
          goto LAB_002a5332;
        }
        if (iVar8 < _Var7._M_current[uVar11 - 1].column) {
LAB_002a535a:
          dVar1 = pHVar18->boundval;
          HVar4 = _Var7._M_current[uVar11 - 1].column;
          HVar3 = _Var7._M_current[uVar11 - 1].boundtype;
          HVar2 = pHVar9->column;
          HVar14 = pHVar9->boundtype;
          pHVar18->boundval = pHVar9->boundval;
          _Var7._M_current[uVar11 - 1].column = HVar2;
          _Var7._M_current[uVar11 - 1].boundtype = HVar14;
          pHVar9->boundval = dVar1;
          pHVar9->column = HVar4;
          pHVar9->boundtype = HVar3;
        }
        else if (iVar8 <= _Var7._M_current[uVar11 - 1].column) {
          if (((int)pHVar9->boundtype < (int)_Var7._M_current[uVar11 - 1].boundtype) ||
             (((int)pHVar9->boundtype <= (int)_Var7._M_current[uVar11 - 1].boundtype &&
              (pHVar9->boundval <= pHVar18->boundval && pHVar18->boundval != pHVar9->boundval))))
          goto LAB_002a535a;
        }
        local_78 = (_Var7._M_current)->boundval;
        uStack_70._0_4_ = (_Var7._M_current)->column;
        uStack_70._4_4_ = (_Var7._M_current)->boundtype;
        HVar2 = pHVar9->column;
        HVar14 = pHVar9->boundtype;
        (_Var7._M_current)->boundval = pHVar9->boundval;
        (_Var7._M_current)->column = HVar2;
        (_Var7._M_current)->boundtype = HVar14;
        pHVar9->boundval = local_78;
        pHVar9->column = (undefined4)uStack_70;
        pHVar9->boundtype = uStack_70._4_4_;
      }
      if ((param_4 & 1) == 0) {
        if (_Var7._M_current[-1].column < (_Var7._M_current)->column) goto LAB_002a53aa;
        if (_Var7._M_current[-1].column <= (_Var7._M_current)->column) {
          if (((int)_Var7._M_current[-1].boundtype < (int)(_Var7._M_current)->boundtype) ||
             (((int)_Var7._M_current[-1].boundtype <= (int)(_Var7._M_current)->boundtype &&
              (_Var7._M_current[-1].boundval <= (_Var7._M_current)->boundval &&
               (_Var7._M_current)->boundval != _Var7._M_current[-1].boundval)))) goto LAB_002a53aa;
        }
        _Var7 = partition_left<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                          (_Var7._M_current,end._M_current);
        begin = _Var7._M_current + 1;
        uVar13 = (long)end._M_current - (long)begin >> 4;
      }
      else {
LAB_002a53aa:
        pVar20 = partition_right<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                           (_Var7._M_current);
        _Var6 = pVar20.first._M_current;
        uVar11 = (long)_Var6._M_current - (long)_Var7._M_current >> 4;
        begin = _Var6._M_current + 1;
        local_38 = (long)end._M_current - (long)begin >> 4;
        if (((long)uVar11 < (long)(uVar13 >> 3)) || ((long)local_38 < (long)(uVar13 >> 3))) {
          local_4c = local_4c + -1;
          if (local_4c == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<HighsDomainChange>>>
                      (_Var7,end,(_Iter_comp_iter<std::less<HighsDomainChange>_> *)&local_78);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<HighsDomainChange>>>
                      (_Var7,end,(_Iter_comp_iter<std::less<HighsDomainChange>_> *)&local_78);
            return;
          }
          if (0x17 < (long)uVar11) {
            uVar13 = uVar11 >> 2;
            dVar1 = (_Var7._M_current)->boundval;
            HVar4 = (_Var7._M_current)->column;
            HVar3 = (_Var7._M_current)->boundtype;
            pHVar9 = _Var7._M_current + uVar13;
            HVar2 = pHVar9->column;
            HVar14 = pHVar9->boundtype;
            (_Var7._M_current)->boundval = pHVar9->boundval;
            (_Var7._M_current)->column = HVar2;
            (_Var7._M_current)->boundtype = HVar14;
            pHVar9 = _Var7._M_current + uVar13;
            pHVar9->boundval = dVar1;
            pHVar9->column = HVar4;
            pHVar9->boundtype = HVar3;
            pHVar9 = _Var6._M_current + -uVar13;
            local_78 = _Var6._M_current[-1].boundval;
            uStack_70._0_4_ = _Var6._M_current[-1].column;
            uStack_70._4_4_ = _Var6._M_current[-1].boundtype;
            HVar2 = pHVar9->column;
            HVar14 = pHVar9->boundtype;
            _Var6._M_current[-1].boundval = pHVar9->boundval;
            _Var6._M_current[-1].column = HVar2;
            _Var6._M_current[-1].boundtype = HVar14;
            pHVar9->boundval = local_78;
            pHVar9->column = (undefined4)uStack_70;
            pHVar9->boundtype = uStack_70._4_4_;
            if (0x80 < uVar11) {
              dVar1 = _Var7._M_current[1].boundval;
              HVar4 = _Var7._M_current[1].column;
              HVar3 = _Var7._M_current[1].boundtype;
              pHVar9 = _Var7._M_current + uVar13 + 1;
              HVar2 = pHVar9->column;
              HVar14 = pHVar9->boundtype;
              _Var7._M_current[1].boundval = pHVar9->boundval;
              _Var7._M_current[1].column = HVar2;
              _Var7._M_current[1].boundtype = HVar14;
              pHVar9 = _Var7._M_current + uVar13 + 1;
              pHVar9->boundval = dVar1;
              pHVar9->column = HVar4;
              pHVar9->boundtype = HVar3;
              dVar1 = _Var7._M_current[2].boundval;
              HVar4 = _Var7._M_current[2].column;
              HVar3 = _Var7._M_current[2].boundtype;
              pHVar9 = _Var7._M_current + uVar13 + 2;
              HVar2 = pHVar9->column;
              HVar14 = pHVar9->boundtype;
              _Var7._M_current[2].boundval = pHVar9->boundval;
              _Var7._M_current[2].column = HVar2;
              _Var7._M_current[2].boundtype = HVar14;
              pHVar9 = _Var7._M_current + uVar13 + 2;
              pHVar9->boundval = dVar1;
              pHVar9->column = HVar4;
              pHVar9->boundtype = HVar3;
              dVar1 = _Var6._M_current[-2].boundval;
              HVar4 = _Var6._M_current[-2].column;
              HVar3 = _Var6._M_current[-2].boundtype;
              pHVar9 = _Var6._M_current + ~uVar13;
              HVar2 = pHVar9->column;
              HVar14 = pHVar9->boundtype;
              _Var6._M_current[-2].boundval = pHVar9->boundval;
              _Var6._M_current[-2].column = HVar2;
              _Var6._M_current[-2].boundtype = HVar14;
              pHVar9 = _Var6._M_current + ~uVar13;
              pHVar9->boundval = dVar1;
              pHVar9->column = HVar4;
              pHVar9->boundtype = HVar3;
              local_78 = _Var6._M_current[-3].boundval;
              uStack_70._0_4_ = _Var6._M_current[-3].column;
              uStack_70._4_4_ = _Var6._M_current[-3].boundtype;
              pHVar9 = _Var6._M_current + (-2 - uVar13);
              HVar2 = pHVar9->column;
              HVar14 = pHVar9->boundtype;
              _Var6._M_current[-3].boundval = pHVar9->boundval;
              _Var6._M_current[-3].column = HVar2;
              _Var6._M_current[-3].boundtype = HVar14;
              pHVar9 = _Var6._M_current + (-2 - uVar13);
              pHVar9->boundval = local_78;
              pHVar9->column = (undefined4)uStack_70;
              pHVar9->boundtype = uStack_70._4_4_;
            }
          }
          if (0x17 < (long)local_38) {
            uVar13 = local_38 >> 2;
            dVar1 = begin->boundval;
            HVar4 = _Var6._M_current[1].column;
            HVar3 = _Var6._M_current[1].boundtype;
            pHVar9 = _Var6._M_current + uVar13 + 1;
            HVar2 = pHVar9->column;
            HVar14 = pHVar9->boundtype;
            begin->boundval = pHVar9->boundval;
            _Var6._M_current[1].column = HVar2;
            _Var6._M_current[1].boundtype = HVar14;
            pHVar9 = _Var6._M_current + uVar13 + 1;
            pHVar9->boundval = dVar1;
            pHVar9->column = HVar4;
            pHVar9->boundtype = HVar3;
            pHVar9 = end._M_current + -uVar13;
            local_78 = local_60->boundval;
            uStack_70._0_4_ = local_60->column;
            uStack_70._4_4_ = local_60->boundtype;
            HVar2 = pHVar9->column;
            HVar14 = pHVar9->boundtype;
            local_60->boundval = pHVar9->boundval;
            local_60->column = HVar2;
            local_60->boundtype = HVar14;
            pHVar9->boundval = local_78;
            pHVar9->column = (undefined4)uStack_70;
            pHVar9->boundtype = uStack_70._4_4_;
            if (0x80 < local_38) {
              dVar1 = _Var6._M_current[2].boundval;
              HVar4 = _Var6._M_current[2].column;
              HVar3 = _Var6._M_current[2].boundtype;
              HVar2 = _Var6._M_current[uVar13 + 2].column;
              HVar14 = _Var6._M_current[uVar13 + 2].boundtype;
              _Var6._M_current[2].boundval = _Var6._M_current[uVar13 + 2].boundval;
              _Var6._M_current[2].column = HVar2;
              _Var6._M_current[2].boundtype = HVar14;
              _Var6._M_current[uVar13 + 2].boundval = dVar1;
              _Var6._M_current[uVar13 + 2].column = HVar4;
              _Var6._M_current[uVar13 + 2].boundtype = HVar3;
              dVar1 = _Var6._M_current[3].boundval;
              HVar4 = _Var6._M_current[3].column;
              HVar3 = _Var6._M_current[3].boundtype;
              HVar2 = _Var6._M_current[uVar13 + 3].column;
              HVar14 = _Var6._M_current[uVar13 + 3].boundtype;
              _Var6._M_current[3].boundval = _Var6._M_current[uVar13 + 3].boundval;
              _Var6._M_current[3].column = HVar2;
              _Var6._M_current[3].boundtype = HVar14;
              _Var6._M_current[uVar13 + 3].boundval = dVar1;
              _Var6._M_current[uVar13 + 3].column = HVar4;
              _Var6._M_current[uVar13 + 3].boundtype = HVar3;
              dVar1 = local_40->boundval;
              HVar4 = local_40->column;
              HVar3 = local_40->boundtype;
              pHVar9 = end._M_current + ~uVar13;
              HVar2 = pHVar9->column;
              HVar14 = pHVar9->boundtype;
              local_40->boundval = pHVar9->boundval;
              local_40->column = HVar2;
              local_40->boundtype = HVar14;
              pHVar9 = end._M_current + ~uVar13;
              pHVar9->boundval = dVar1;
              pHVar9->column = HVar4;
              pHVar9->boundtype = HVar3;
              local_78 = local_48->boundval;
              uStack_70._0_4_ = local_48->column;
              uStack_70._4_4_ = local_48->boundtype;
              pHVar9 = end._M_current + (-2 - uVar13);
              HVar2 = pHVar9->column;
              HVar14 = pHVar9->boundtype;
              local_48->boundval = pHVar9->boundval;
              local_48->column = HVar2;
              local_48->boundtype = HVar14;
              pHVar9 = end._M_current + (-2 - uVar13);
              pHVar9->boundval = local_78;
              pHVar9->column = (undefined4)uStack_70;
              pHVar9->boundtype = uStack_70._4_4_;
            }
          }
        }
        else if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_58 = _Var7._M_current;
          if (_Var7._M_current + 1 != _Var6._M_current && _Var7._M_current != _Var6._M_current) {
            lVar5 = 0;
            uVar13 = 0;
            _Var15._M_current = _Var7._M_current;
            pHVar9 = _Var7._M_current + 1;
            do {
              iVar8 = _Var15._M_current[1].column;
              if (iVar8 < (_Var15._M_current)->column) {
                HVar14 = _Var15._M_current[1].boundtype;
LAB_002a542d:
                dVar1 = _Var15._M_current[1].boundval;
                pHVar10 = pHVar9 + -1;
                HVar2 = (_Var15._M_current)->column;
                HVar3 = (_Var15._M_current)->boundtype;
                pHVar9->boundval = (_Var15._M_current)->boundval;
                pHVar9->column = HVar2;
                pHVar9->boundtype = HVar3;
                lVar19 = lVar5;
                _Var15._M_current = _Var7._M_current;
                pHVar18 = pHVar9;
                if (pHVar10 != _Var7._M_current) {
                  do {
                    pHVar16 = pHVar10 + -1;
                    if (pHVar10[-1].column <= iVar8) {
                      _Var15._M_current = pHVar10;
                      if (pHVar10[-1].column < iVar8) break;
                      if ((int)pHVar10[-1].boundtype <= (int)HVar14) {
                        if ((int)pHVar10[-1].boundtype < (int)HVar14) {
                          pHVar18 = pHVar10 + 1;
                          break;
                        }
                        if (pHVar16->boundval <= dVar1) break;
                      }
                    }
                    HVar2 = pHVar10[-1].column;
                    HVar3 = pHVar10[-1].boundtype;
                    pHVar10->boundval = pHVar16->boundval;
                    pHVar10->column = HVar2;
                    pHVar10->boundtype = HVar3;
                    lVar19 = lVar19 + 0x10;
                    _Var15._M_current = _Var7._M_current;
                    pHVar18 = pHVar10;
                    pHVar10 = pHVar16;
                  } while (lVar19 != 0);
                }
                (_Var15._M_current)->boundval = dVar1;
                pHVar18[-1].column = iVar8;
                pHVar18[-1].boundtype = HVar14;
                uVar13 = uVar13 + ((long)pHVar9 - (long)_Var15._M_current >> 4);
                if (8 < uVar13) goto LAB_002a5ab4;
              }
              else if (iVar8 <= (_Var15._M_current)->column) {
                HVar14 = _Var15._M_current[1].boundtype;
                if (((int)HVar14 < (int)(_Var15._M_current)->boundtype) ||
                   (((int)HVar14 <= (int)(_Var15._M_current)->boundtype &&
                    (pHVar9->boundval <= (_Var15._M_current)->boundval &&
                     (_Var15._M_current)->boundval != pHVar9->boundval)))) goto LAB_002a542d;
              }
              pHVar10 = pHVar9 + 1;
              lVar5 = lVar5 + -0x10;
              _Var15._M_current = pHVar9;
              pHVar9 = pHVar10;
            } while (pHVar10 != _Var6._M_current);
          }
          if (begin == end._M_current) {
            return;
          }
          if (_Var6._M_current + 2 == end._M_current) {
            return;
          }
          lVar5 = 0x20;
          lVar19 = 0;
          uVar13 = 0;
          pHVar9 = begin;
          do {
            pHVar10 = (HighsDomainChange *)((long)&(_Var6._M_current)->boundval + lVar5);
            iVar8 = pHVar9[1].column;
            if (iVar8 < pHVar9->column) {
              HVar14 = pHVar9[1].boundtype;
LAB_002a5536:
              dVar1 = pHVar10->boundval;
              HVar2 = pHVar9->column;
              HVar3 = pHVar9->boundtype;
              pHVar10->boundval = pHVar9->boundval;
              pHVar10->column = HVar2;
              pHVar10->boundtype = HVar3;
              pHVar9 = begin;
              pHVar18 = pHVar10;
              if (lVar5 != 0x20) {
                lVar12 = lVar19;
                pHVar16 = (HighsDomainChange *)((long)&_Var6._M_current[-1].boundval + lVar5);
                do {
                  pHVar17 = pHVar16;
                  pHVar16 = pHVar17 + -1;
                  if (pHVar17[-1].column <= iVar8) {
                    pHVar9 = pHVar17;
                    if (pHVar17[-1].column < iVar8) break;
                    if ((int)pHVar17[-1].boundtype <= (int)HVar14) {
                      if ((int)pHVar17[-1].boundtype < (int)HVar14) {
                        pHVar18 = pHVar17 + 1;
                        break;
                      }
                      if (pHVar16->boundval <= dVar1) break;
                    }
                  }
                  HVar2 = pHVar17[-1].column;
                  HVar3 = pHVar17[-1].boundtype;
                  pHVar17->boundval = pHVar16->boundval;
                  pHVar17->column = HVar2;
                  pHVar17->boundtype = HVar3;
                  lVar12 = lVar12 + 0x10;
                  pHVar9 = begin;
                  pHVar18 = pHVar17;
                } while (lVar12 != 0);
              }
              pHVar9->boundval = dVar1;
              pHVar18[-1].column = iVar8;
              pHVar18[-1].boundtype = HVar14;
              uVar13 = uVar13 + ((long)pHVar10 - (long)pHVar9 >> 4);
              if (8 < uVar13) break;
            }
            else if (iVar8 <= pHVar9->column) {
              HVar14 = pHVar9[1].boundtype;
              if (((int)HVar14 < (int)pHVar9->boundtype) ||
                 (((int)HVar14 <= (int)pHVar9->boundtype &&
                  (pHVar10->boundval <= pHVar9->boundval && pHVar9->boundval != pHVar10->boundval)))
                 ) goto LAB_002a5536;
            }
            pHVar18 = (HighsDomainChange *)((long)&_Var6._M_current[1].boundval + lVar5);
            lVar5 = lVar5 + 0x10;
            lVar19 = lVar19 + -0x10;
            pHVar9 = pHVar10;
            if (pHVar18 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_002a5ab4:
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>,false>
                  (_Var7._M_current,_Var6._M_current,local_4c,param_4 & 1);
        param_4 = 0;
        uVar13 = local_38;
      }
      _Var7._M_current = begin;
    } while (0x17 < (long)uVar13);
    if ((param_4 & 1) == 0) goto LAB_002a5aec;
  }
  if (begin + 1 != end._M_current && begin != end._M_current) {
    lVar5 = 0;
    pHVar9 = begin;
    pHVar10 = begin + 1;
    do {
      iVar8 = pHVar9[1].column;
      if (iVar8 < pHVar9->column) {
        HVar14 = pHVar9[1].boundtype;
LAB_002a4fb8:
        dVar1 = pHVar9[1].boundval;
        pHVar18 = pHVar10 + -1;
        HVar2 = pHVar9->column;
        HVar3 = pHVar9->boundtype;
        pHVar10->boundval = pHVar9->boundval;
        pHVar10->column = HVar2;
        pHVar10->boundtype = HVar3;
        pHVar9 = begin;
        pHVar16 = pHVar10;
        lVar19 = lVar5;
        if (pHVar18 != begin) {
          do {
            pHVar17 = pHVar18 + -1;
            if (pHVar18[-1].column <= iVar8) {
              pHVar9 = pHVar18;
              if (pHVar18[-1].column < iVar8) break;
              if ((int)pHVar18[-1].boundtype <= (int)HVar14) {
                if ((int)pHVar18[-1].boundtype < (int)HVar14) {
                  pHVar16 = pHVar18 + 1;
                  break;
                }
                if (pHVar17->boundval <= dVar1) break;
              }
            }
            HVar2 = pHVar18[-1].column;
            HVar3 = pHVar18[-1].boundtype;
            pHVar18->boundval = pHVar17->boundval;
            pHVar18->column = HVar2;
            pHVar18->boundtype = HVar3;
            lVar19 = lVar19 + 0x10;
            pHVar9 = begin;
            pHVar16 = pHVar18;
            pHVar18 = pHVar17;
          } while (lVar19 != 0);
        }
        pHVar9->boundval = dVar1;
        pHVar16[-1].column = iVar8;
        pHVar16[-1].boundtype = HVar14;
      }
      else if (iVar8 <= pHVar9->column) {
        HVar14 = pHVar9[1].boundtype;
        if (((int)HVar14 < (int)pHVar9->boundtype) ||
           (((int)HVar14 <= (int)pHVar9->boundtype &&
            (pHVar10->boundval <= pHVar9->boundval && pHVar9->boundval != pHVar10->boundval))))
        goto LAB_002a4fb8;
      }
      pHVar18 = pHVar10 + 1;
      lVar5 = lVar5 + -0x10;
      pHVar9 = pHVar10;
      pHVar10 = pHVar18;
    } while (pHVar18 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }